

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_16_bit_from_file(FILE *f)

{
  int iVar1;
  stbi__context *s_00;
  FILE *in_RDI;
  long pos;
  stbi__context s;
  int r;
  stbi__context *in_stack_ffffffffffffff10;
  
  s_00 = (stbi__context *)ftell(in_RDI);
  stbi__start_file(in_stack_ffffffffffffff10,(FILE *)s_00);
  iVar1 = stbi__is_16_main(s_00);
  fseek(in_RDI,(long)s_00,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_16_bit_from_file(FILE *f)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__is_16_main(&s);
   fseek(f,pos,SEEK_SET);
   return r;
}